

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O3

void VP8LClear(VP8LDecoder *dec)

{
  uint32_t **ppuVar1;
  long lVar2;
  
  ClearMetadata(&dec->hdr_);
  WebPSafeFree(dec->pixels_);
  dec->pixels_ = (uint32_t *)0x0;
  if (0 < dec->next_transform_) {
    ppuVar1 = &dec->transforms_[0].data_;
    lVar2 = 0;
    do {
      WebPSafeFree(*ppuVar1);
      *ppuVar1 = (uint32_t *)0x0;
      lVar2 = lVar2 + 1;
      ppuVar1 = ppuVar1 + 3;
    } while (lVar2 < dec->next_transform_);
  }
  dec->next_transform_ = 0;
  dec->transforms_seen_ = 0;
  WebPSafeFree(dec->rescaler_memory);
  dec->rescaler_memory = (uint8_t *)0x0;
  dec->output_ = (WebPDecBuffer *)0x0;
  return;
}

Assistant:

static void VP8LClear(VP8LDecoder* const dec) {
  int i;
  if (dec == NULL) return;
  ClearMetadata(&dec->hdr_);

  WebPSafeFree(dec->pixels_);
  dec->pixels_ = NULL;
  for (i = 0; i < dec->next_transform_; ++i) {
    ClearTransform(&dec->transforms_[i]);
  }
  dec->next_transform_ = 0;
  dec->transforms_seen_ = 0;

  WebPSafeFree(dec->rescaler_memory);
  dec->rescaler_memory = NULL;

  dec->output_ = NULL;   // leave no trace behind
}